

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

uint32_t djb2_hash(char *str)

{
  char cVar1;
  int local_18;
  uint32_t local_14;
  wchar_t c;
  uint32_t hash;
  char *str_local;
  
  local_14 = 0x1505;
  cVar1 = *str;
  _c = str;
  while (local_18 = (int)cVar1, local_18 != 0) {
    local_14 = local_14 * 0x21 + local_18;
    cVar1 = _c[1];
    _c = _c + 1;
  }
  return local_14;
}

Assistant:

uint32_t djb2_hash(const char *str)
{
	uint32_t hash = 5381;
	int c = *str;

	while (c)
	{
		hash = ((hash << 5) + hash) + c; /* hash * 33 + c */
		c = *++str;
	}

	return hash;
}